

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O3

var __thiscall cs::runtime_type::parse_mod(runtime_type *this,var *a,var *b)

{
  char *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined *puVar3;
  numeric *pnVar4;
  runtime_error *this_00;
  any *in_RCX;
  string local_48;
  longdouble local_24;
  
  if (b->mDat == (proxy *)0x0) {
    puVar3 = &void::typeinfo;
  }
  else {
    iVar2 = (*b->mDat->data->_vptr_baseHolder[2])();
    puVar3 = (undefined *)CONCAT44(extraout_var,iVar2);
  }
  pcVar1 = *(char **)(puVar3 + 8);
  if ((pcVar1 == "N2cs7numericE") ||
     ((*pcVar1 != '*' && (iVar2 = strcmp(pcVar1,"N2cs7numericE"), iVar2 == 0)))) {
    if (in_RCX->mDat == (proxy *)0x0) {
      puVar3 = &void::typeinfo;
    }
    else {
      iVar2 = (*in_RCX->mDat->data->_vptr_baseHolder[2])();
      puVar3 = (undefined *)CONCAT44(extraout_var_00,iVar2);
    }
    pcVar1 = *(char **)(puVar3 + 8);
    if ((pcVar1 == "N2cs7numericE") ||
       ((*pcVar1 != '*' && (iVar2 = strcmp(pcVar1,"N2cs7numericE"), iVar2 == 0)))) {
      pnVar4 = cs_impl::any::const_val<cs::numeric>(b);
      local_24 = *(longdouble *)&pnVar4->data;
      if (pnVar4->type != false) {
        local_24 = (longdouble)(pnVar4->data)._int;
      }
      cs_impl::any::const_val<cs::numeric>(in_RCX);
      fmodl();
      local_48.field_2._M_local_buf[0] = '\0';
      cs_impl::any::any<cs::numeric>((any *)this,(numeric *)&local_48);
      return (var)(proxy *)this;
    }
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Unsupported operator operations(Mod).","");
  runtime_error::runtime_error(this_00,&local_48);
  __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

var runtime_type::parse_mod(const var &a, const var &b)
	{
		if (a.type() == typeid(numeric) && b.type() == typeid(numeric))
			return numeric(std::fmod(a.const_val<numeric>().as_float(), b.const_val<numeric>().as_float()));
		else
			throw runtime_error("Unsupported operator operations(Mod).");
	}